

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O0

void __thiscall FIX::FileStore::~FileStore(FileStore *this)

{
  FileStore *this_local;
  
  (this->super_MessageStore)._vptr_MessageStore = (_func_int **)&PTR__FileStore_0030bb98;
  if (this->m_msgFile != (FILE *)0x0) {
    fclose((FILE *)this->m_msgFile);
  }
  if (this->m_headerFile != (FILE *)0x0) {
    fclose((FILE *)this->m_headerFile);
  }
  if (this->m_seqNumsFile != (FILE *)0x0) {
    fclose((FILE *)this->m_seqNumsFile);
  }
  if (this->m_sessionFile != (FILE *)0x0) {
    fclose((FILE *)this->m_sessionFile);
  }
  std::__cxx11::string::~string((string *)&this->m_sessionFileName);
  std::__cxx11::string::~string((string *)&this->m_seqNumsFileName);
  std::__cxx11::string::~string((string *)&this->m_headerFileName);
  std::__cxx11::string::~string((string *)&this->m_msgFileName);
  std::
  map<int,_std::pair<long,_unsigned_long>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<long,_unsigned_long>_>_>_>
  ::~map(&this->m_offsets);
  MemoryStore::~MemoryStore(&this->m_cache);
  MessageStore::~MessageStore(&this->super_MessageStore);
  return;
}

Assistant:

FileStore::~FileStore()
{
  if( m_msgFile ) fclose( m_msgFile );
  if( m_headerFile ) fclose( m_headerFile );
  if( m_seqNumsFile ) fclose( m_seqNumsFile );
  if( m_sessionFile ) fclose( m_sessionFile );
}